

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

void __thiscall QAuthenticatorPrivate::~QAuthenticatorPrivate(QAuthenticatorPrivate *this)

{
  QHash<QString,_QVariant> *in_RDI;
  
  QString::~QString((QString *)0x205703);
  QString::~QString((QString *)0x205714);
  QByteArray::~QByteArray((QByteArray *)0x205725);
  QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_>::~QScopedPointer
            ((QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_> *)in_RDI);
  QByteArray::~QByteArray((QByteArray *)0x205744);
  QString::~QString((QString *)0x205752);
  QHash<QString,_QVariant>::~QHash(in_RDI);
  QString::~QString((QString *)0x20576e);
  QString::~QString((QString *)0x20577c);
  QString::~QString((QString *)0x205786);
  return;
}

Assistant:

QAuthenticatorPrivate::~QAuthenticatorPrivate() = default;